

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStorage.cpp
# Opt level: O2

array_t<signed_char,_16> __thiscall
CoreML::MilStoragePython::MilStoragePythonReader::read_int4_data
          (MilStoragePythonReader *this,uint64_t offset)

{
  uchar *__first;
  uint64_t in_RDX;
  long lVar1;
  Span<const_MILBlob::Int4,_18446744073709551615UL> SVar2;
  vector<MILBlob::Int4,_std::allocator<MILBlob::Int4>_> unpackedInt4Data;
  allocator_type local_41;
  _Vector_base<MILBlob::Int4,_std::allocator<MILBlob::Int4>_> local_40;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  SVar2 = MILBlob::Blob::StorageReader::GetDataView<MILBlob::Int4>(*(StorageReader **)offset,in_RDX)
  ;
  __first = (uchar *)SVar2.m_ptr;
  lVar1 = (ulong)((uint)SVar2.m_size.m_size & 1) +
          (SVar2.m_size.m_size.m_size >> 1 & 0x1fffffffffffffff);
  if (lVar1 == 0) {
    __first = (uchar *)0x0;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_28,__first,
             __first + lVar1,&local_41);
  MILBlob::UnPackSubByteVec<MILBlob::Int4>
            ((vector<MILBlob::Int4,_std::allocator<MILBlob::Int4>_> *)&local_40,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,
             SVar2.m_size.m_size.m_size);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  pybind11::array_t<signed_char,_16>::array_t
            ((array_t<signed_char,_16> *)this,
             (long)local_40._M_impl.super__Vector_impl_data._M_finish -
             (long)local_40._M_impl.super__Vector_impl_data._M_start,
             &(local_40._M_impl.super__Vector_impl_data._M_start)->data,(handle)0x0);
  std::_Vector_base<MILBlob::Int4,_std::allocator<MILBlob::Int4>_>::~_Vector_base(&local_40);
  return (array)(array)this;
}

Assistant:

py::array_t<int8_t> MilStoragePythonReader::read_int4_data(uint64_t offset) {
    // First read packed data using MILBlob reader, and restore to int8 values which represents int4.
    auto int4SpanData = m_reader->GetDataView<MILBlob::Int4>(offset);
    MILBlob::Util::Span<const uint8_t> packedValuesSpan = MILBlob::Util::CastFromBitSpan<const MILBlob::Int4>(int4SpanData);
    auto unpackedInt4Data = MILBlob::UnPackSubByteVec<MILBlob::Int4>({packedValuesSpan.begin(), packedValuesSpan.end()}, int4SpanData.Size());
    return py::array_t<int8_t>(unpackedInt4Data.size(), reinterpret_cast<int8_t*>(unpackedInt4Data.data()));
}